

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O1

void wallet::StartWallets(WalletContext *context)

{
  ArgsManager *this;
  Function f;
  Function f_00;
  bool bVar1;
  shared_ptr<wallet::CWallet> *pwallet;
  _Alloc_hider _Var2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  _Manager_type in_stack_ffffffffffffff88;
  code *pcVar3;
  _Invoker_type in_stack_ffffffffffffff90;
  WalletContext *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              *)&local_48,context);
  for (_Var2._M_p = local_48._M_dataplus._M_p; _Var2._M_p != (pointer)local_48._M_string_length;
      _Var2._M_p = _Var2._M_p + 0x10) {
    CWallet::postInitProcess(*(CWallet **)_Var2._M_p);
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             *)&local_48);
  this = context->args;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-flushwallet","");
  bVar1 = ArgsManager::GetBoolArg(this,&local_48,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    uStack_60 = 0;
    pcStack_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/load.cpp:164:42)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/load.cpp:164:42)>
               ::_M_manager;
    f.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff80;
    f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff78;
    f.super__Function_base._M_manager = in_stack_ffffffffffffff88;
    f._M_invoker = in_stack_ffffffffffffff90;
    local_68 = context;
    CScheduler::scheduleEvery(context->scheduler,f,(milliseconds)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  pcVar3 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/load.cpp:166:38)>
           ::_M_manager;
  f_00.super__Function_base._M_functor._8_8_ = 0;
  f_00.super__Function_base._M_functor._M_unused._M_object = context;
  f_00.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/load.cpp:166:38)>
       ::_M_manager;
  f_00._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/load.cpp:166:38)>
       ::_M_invoke;
  CScheduler::scheduleEvery(context->scheduler,f_00,(milliseconds)&stack0xffffffffffffff78);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xffffffffffffff78,&stack0xffffffffffffff78,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartWallets(WalletContext& context)
{
    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        pwallet->postInitProcess();
    }

    // Schedule periodic wallet flushes and tx rebroadcasts
    if (context.args->GetBoolArg("-flushwallet", DEFAULT_FLUSHWALLET)) {
        context.scheduler->scheduleEvery([&context] { MaybeCompactWalletDB(context); }, 500ms);
    }
    context.scheduler->scheduleEvery([&context] { MaybeResendWalletTxs(context); }, 1min);
}